

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set,int pos,int hasNsNodes)

{
  xmlNodePtr ns;
  int iVar1;
  long lVar2;
  
  if ((set != (xmlNodeSetPtr)0x0) && (iVar1 = set->nodeNr, pos < iVar1)) {
    if (hasNsNodes != 0) {
      for (lVar2 = (long)pos; lVar2 < iVar1; lVar2 = lVar2 + 1) {
        ns = set->nodeTab[lVar2];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
          iVar1 = set->nodeNr;
        }
      }
    }
    set->nodeNr = pos;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetClearFromPos(xmlNodeSetPtr set, int pos, int hasNsNodes)
{
    if ((set == NULL) || (pos >= set->nodeNr))
	return;
    else if ((hasNsNodes)) {
	int i;
	xmlNodePtr node;

	for (i = pos; i < set->nodeNr; i++) {
	    node = set->nodeTab[i];
	    if ((node != NULL) &&
		(node->type == XML_NAMESPACE_DECL))
		xmlXPathNodeSetFreeNs((xmlNsPtr) node);
	}
    }
    set->nodeNr = pos;
}